

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O0

size_t FSE_compress_wksp(void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,
                        uint tableLog,void *workSpace,size_t wkspSize)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint *count_00;
  size_t total;
  void *code;
  void *in_RCX;
  int in_R8D;
  uint in_R9D;
  long in_stack_00000008;
  ulong in_stack_00000010;
  size_t cSize;
  size_t _var_err___1;
  size_t nc_err;
  size_t _var_err__;
  size_t maxCount;
  size_t scratchBufferSize;
  void *scratchBuffer;
  size_t CTableSize;
  FSE_CTable *CTable;
  S16 norm [256];
  U32 count [256];
  BYTE *oend;
  BYTE *op;
  BYTE *ostart;
  undefined4 in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff968;
  uint *in_stack_fffffffffffff970;
  uint *in_stack_fffffffffffff978;
  uint tableLog_00;
  short *in_stack_fffffffffffff9b8;
  size_t in_stack_fffffffffffffdd8;
  void *in_stack_fffffffffffffde0;
  uint in_stack_fffffffffffffde8;
  uint in_stack_fffffffffffffdec;
  short *in_stack_fffffffffffffdf0;
  FSE_CTable *in_stack_fffffffffffffdf8;
  void *local_8;
  
  cVar1 = (char)in_R9D;
  count_00 = (uint *)(ulong)(uint)((1 << (cVar1 - 1U & 0x1f)) + 1 + (in_R8D + 1) * 2);
  total = in_stack_00000008 + (long)count_00 * 4;
  uVar5 = (uint)(in_stack_00000010 + (long)count_00 * -4 >> 0x20);
  iVar2 = (1 << (cVar1 - 1U & 0x1f)) + 1 + (in_R8D + 1) * 2;
  if (in_R9D < 0xd) {
    iVar3 = 0x400;
  }
  else {
    iVar3 = 1 << (cVar1 - 2U & 0x1f);
  }
  if (in_stack_00000010 < (uint)(iVar2 + iVar3)) {
    local_8 = (void *)0xfffffffffffffffb;
  }
  else if (in_RCX < (void *)0x2) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = (void *)HIST_count_wksp(in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                                      (void *)CONCAT44(iVar2,in_stack_fffffffffffff968),
                                      in_stack_00000010,
                                      (uint *)CONCAT44(iVar3,in_stack_fffffffffffff958));
    tableLog_00 = (uint)((ulong)in_stack_00000008 >> 0x20);
    uVar4 = ERR_isError((size_t)local_8);
    if (uVar4 == 0) {
      if (local_8 == in_RCX) {
        local_8 = (void *)0x1;
      }
      else if (local_8 == (void *)0x1) {
        local_8 = (void *)0x0;
      }
      else if (local_8 < (void *)((ulong)in_RCX >> 7)) {
        local_8 = (void *)0x0;
      }
      else {
        FSE_optimalTableLog((uint)(in_stack_00000010 >> 0x20),
                            CONCAT44(iVar3,in_stack_fffffffffffff958),0);
        local_8 = (void *)FSE_normalizeCount(in_stack_fffffffffffff9b8,tableLog_00,count_00,total,
                                             uVar5);
        uVar5 = ERR_isError((size_t)local_8);
        if (uVar5 == 0) {
          code = (void *)FSE_writeNCount(in_stack_fffffffffffff978,(size_t)in_stack_fffffffffffff970
                                         ,(short *)CONCAT44(iVar2,in_stack_fffffffffffff968),
                                         (uint)(in_stack_00000010 >> 0x20),(uint)in_stack_00000010);
          uVar5 = ERR_isError((size_t)code);
          local_8 = code;
          if (uVar5 == 0) {
            local_8 = (void *)FSE_buildCTable_wksp
                                        (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                                         in_stack_fffffffffffffdec,in_stack_fffffffffffffde8,
                                         in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
            uVar5 = ERR_isError((size_t)local_8);
            if (uVar5 == 0) {
              local_8 = (void *)FSE_compress_usingCTable
                                          (local_8,(size_t)in_stack_fffffffffffff970,
                                           (void *)CONCAT44(iVar2,in_stack_fffffffffffff968),
                                           in_stack_00000010,
                                           (FSE_CTable *)CONCAT44(iVar3,in_stack_fffffffffffff958));
              uVar5 = ERR_isError((size_t)local_8);
              if (uVar5 == 0) {
                if (local_8 == (void *)0x0) {
                  local_8 = (void *)0x0;
                }
                else if ((ulong)((long)local_8 + (long)code) < (long)in_RCX - 1U) {
                  local_8 = (void *)((long)local_8 + (long)code);
                }
                else {
                  local_8 = (void *)0x0;
                }
              }
            }
          }
        }
      }
    }
  }
  return (size_t)local_8;
}

Assistant:

size_t FSE_compress_wksp (void* dst, size_t dstSize, const void* src, size_t srcSize, unsigned maxSymbolValue, unsigned tableLog, void* workSpace, size_t wkspSize)
{
    BYTE* const ostart = (BYTE*) dst;
    BYTE* op = ostart;
    BYTE* const oend = ostart + dstSize;

    U32   count[FSE_MAX_SYMBOL_VALUE+1];
    S16   norm[FSE_MAX_SYMBOL_VALUE+1];
    FSE_CTable* CTable = (FSE_CTable*)workSpace;
    size_t const CTableSize = FSE_CTABLE_SIZE_U32(tableLog, maxSymbolValue);
    void* scratchBuffer = (void*)(CTable + CTableSize);
    size_t const scratchBufferSize = wkspSize - (CTableSize * sizeof(FSE_CTable));

    /* init conditions */
    if (wkspSize < FSE_WKSP_SIZE_U32(tableLog, maxSymbolValue)) return ERROR(tableLog_tooLarge);
    if (srcSize <= 1) return 0;  /* Not compressible */
    if (!maxSymbolValue) maxSymbolValue = FSE_MAX_SYMBOL_VALUE;
    if (!tableLog) tableLog = FSE_DEFAULT_TABLELOG;

    /* Scan input and build symbol stats */
    {   CHECK_V_F(maxCount, HIST_count_wksp(count, &maxSymbolValue, src, srcSize, (unsigned*)scratchBuffer) );
        if (maxCount == srcSize) return 1;   /* only a single symbol in src : rle */
        if (maxCount == 1) return 0;         /* each symbol present maximum once => not compressible */
        if (maxCount < (srcSize >> 7)) return 0;   /* Heuristic : not compressible enough */
    }

    tableLog = FSE_optimalTableLog(tableLog, srcSize, maxSymbolValue);
    CHECK_F( FSE_normalizeCount(norm, tableLog, count, srcSize, maxSymbolValue) );

    /* Write table description header */
    {   CHECK_V_F(nc_err, FSE_writeNCount(op, oend-op, norm, maxSymbolValue, tableLog) );
        op += nc_err;
    }

    /* Compress */
    CHECK_F( FSE_buildCTable_wksp(CTable, norm, maxSymbolValue, tableLog, scratchBuffer, scratchBufferSize) );
    {   CHECK_V_F(cSize, FSE_compress_usingCTable(op, oend - op, src, srcSize, CTable) );
        if (cSize == 0) return 0;   /* not enough space for compressed data */
        op += cSize;
    }

    /* check compressibility */
    if ( (size_t)(op-ostart) >= srcSize-1 ) return 0;

    return op-ostart;
}